

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O0

char __thiscall kj::parse::_::InterpretEscape::operator()(InterpretEscape *this,char c)

{
  char c_local;
  InterpretEscape *this_local;
  
  switch(c) {
  case 'a':
    this_local._7_1_ = '\a';
    break;
  case 'b':
    this_local._7_1_ = '\b';
    break;
  default:
    this_local._7_1_ = c;
    break;
  case 'f':
    this_local._7_1_ = '\f';
    break;
  case 'n':
    this_local._7_1_ = '\n';
    break;
  case 'r':
    this_local._7_1_ = '\r';
    break;
  case 't':
    this_local._7_1_ = '\t';
    break;
  case 'v':
    this_local._7_1_ = '\v';
  }
  return this_local._7_1_;
}

Assistant:

char operator()(char c) const {
    switch (c) {
      case 'a': return '\a';
      case 'b': return '\b';
      case 'f': return '\f';
      case 'n': return '\n';
      case 'r': return '\r';
      case 't': return '\t';
      case 'v': return '\v';
      default: return c;
    }
  }